

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Concat_x86::forward
          (Concat_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  uint uVar2;
  Mat *pMVar3;
  byte bVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  size_t *psVar8;
  int *piVar9;
  void *pvVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  void *pvVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  undefined4 *puVar18;
  int iVar19;
  long lVar20;
  void *pvVar21;
  size_t b;
  ulong uVar22;
  size_t sVar23;
  ulong uVar24;
  size_t b_1;
  int i;
  void *pvVar25;
  ulong uVar26;
  pointer pMVar27;
  bool bVar28;
  Mat local_90;
  int local_48;
  int local_44;
  Mat *local_40;
  long local_38;
  
  pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar2 = pMVar27->dims;
  iVar6 = *(int *)(&this->field_0xd0 + (long)this->_vptr_Concat_x86[-3]);
  if (uVar2 == 1) {
    lVar5 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar27) / 0x48;
    piVar9 = &pMVar27->w;
    uVar12 = 0;
    while (bVar28 = lVar5 != 0, lVar5 = lVar5 + -1, bVar28) {
      uVar12 = uVar12 + piVar9[-5] * *piVar9;
      piVar9 = piVar9 + 0x12;
    }
    bVar4 = (uVar12 & 3) == 0 & opt->use_packing_layout;
    iVar19 = (uint)bVar4 + (uint)bVar4 * 2 + 1;
    pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar3,(int)uVar12 / iVar19,
                pMVar27->elemsize / (ulong)(long)pMVar27->elempack << bVar4 * '\x02',iVar19,
                opt->blob_allocator);
    pvVar25 = pMVar3->data;
    if (pvVar25 == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar3->c * pMVar3->cstep == 0) {
      return -100;
    }
    lVar5 = 0x2c;
    for (uVar22 = 0;
        pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        uVar22 < (ulong)(((long)(bottom_blobs->
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                super__Vector_impl_data._M_finish - (long)pMVar27) / 0x48);
        uVar22 = uVar22 + 1) {
      memcpy(pvVar25,*(void **)((long)pMVar27 + lVar5 + -0x2c),
             (long)*(int *)((long)&pMVar27->data + lVar5) * *(long *)((long)pMVar27 + lVar5 + -0x1c)
            );
      pvVar25 = (void *)((long)pvVar25 +
                        (long)*(int *)((long)pMVar27 + lVar5 + -0x14) *
                        (long)*(int *)((long)&pMVar27->data + lVar5) * 4);
      lVar5 = lVar5 + 0x48;
    }
  }
  iVar6 = (iVar6 >> 0x1f & uVar2) + iVar6;
  if ((uVar2 == 2) && (iVar6 == 0)) {
    iVar19 = pMVar27->w;
    sVar23 = pMVar27->elemsize;
    iVar13 = pMVar27->elempack;
    lVar5 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar27) / 0x48;
    piVar9 = &pMVar27->h;
    uVar12 = 0;
    while (bVar28 = lVar5 != 0, lVar5 = lVar5 + -1, bVar28) {
      if (*(ulong *)(piVar9 + -8) < sVar23) {
        sVar23 = *(ulong *)(piVar9 + -8);
      }
      iVar11 = piVar9[-6];
      if (iVar11 < iVar13) {
        iVar13 = iVar11;
      }
      uVar12 = uVar12 + iVar11 * *piVar9;
      piVar9 = piVar9 + 0x12;
    }
    bVar4 = (uVar12 & 3) == 0 & opt->use_packing_layout;
    iVar11 = (uint)bVar4 + (uint)bVar4 * 2 + 1;
    pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar3,iVar19,(int)uVar12 / iVar11,sVar23 / (ulong)(long)iVar13 << bVar4 * '\x02',
                iVar11,opt->blob_allocator);
    local_90.data = pMVar3->data;
    if (local_90.data == (void *)0x0) {
      return -100;
    }
    local_90.cstep = pMVar3->cstep;
    local_90.c = pMVar3->c;
    if (local_90.cstep * (long)local_90.c == 0) {
      return -100;
    }
    local_90.refcount = pMVar3->refcount;
    local_90.elemsize = pMVar3->elemsize;
    local_90.elempack = pMVar3->elempack;
    local_90.allocator = pMVar3->allocator;
    local_90.dims = pMVar3->dims;
    local_90.w = pMVar3->w;
    local_90.h = pMVar3->h;
    local_90.d = pMVar3->d;
    if (local_90.refcount != (int *)0x0) {
      LOCK();
      *local_90.refcount = *local_90.refcount + 1;
      UNLOCK();
    }
    if ((iVar11 <= iVar13) ||
       ((Mat::create(&local_90,iVar19,(int)uVar12 / iVar13,sVar23,iVar13,opt->workspace_allocator),
        local_90.data != (void *)0x0 && ((long)local_90.c * local_90.cstep != 0)))) {
      iVar17 = 0;
      if (0 < iVar19) {
        iVar17 = iVar19;
      }
      lVar5 = (long)(iVar19 * 4) * 4;
      local_38 = (long)iVar19 * 4;
      pvVar25 = local_90.data;
      local_48 = iVar11;
      local_44 = iVar13;
      local_40 = pMVar3;
      for (uVar22 = 0;
          pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start,
          uVar22 < (ulong)(((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar27) / 0x48);
          uVar22 = uVar22 + 1) {
        pMVar1 = pMVar27 + uVar22;
        iVar11 = pMVar27[uVar22].elempack;
        if ((iVar11 == 4) && (iVar13 == 1)) {
          uVar7 = (ulong)(uint)pMVar1->h;
          if (pMVar1->h < 1) {
            uVar7 = 0;
          }
          pvVar10 = (void *)((long)(iVar19 * 3) * 4 + (long)pvVar25);
          pvVar14 = (void *)((long)(iVar19 * 2) * 4 + (long)pvVar25);
          lVar15 = local_38 + (long)pvVar25;
          for (uVar16 = 0; uVar16 != uVar7; uVar16 = uVar16 + 1) {
            puVar18 = (undefined4 *)
                      ((long)pMVar1->w * uVar16 * pMVar1->elemsize + (long)pMVar1->data);
            for (lVar20 = 0; iVar17 != (int)lVar20; lVar20 = lVar20 + 1) {
              *(undefined4 *)((long)pvVar25 + lVar20 * 4) = *puVar18;
              *(undefined4 *)(lVar15 + lVar20 * 4) = puVar18[1];
              *(undefined4 *)((long)pvVar14 + lVar20 * 4) = puVar18[2];
              *(undefined4 *)((long)pvVar10 + lVar20 * 4) = puVar18[3];
              puVar18 = puVar18 + 4;
            }
            pvVar25 = (void *)((long)pvVar25 + lVar5);
            pvVar10 = (void *)((long)pvVar10 + lVar5);
            pvVar14 = (void *)((long)pvVar14 + lVar5);
            lVar15 = lVar15 + lVar5;
          }
        }
        if (iVar11 == iVar13) {
          lVar15 = (long)pMVar1->h * (long)iVar19;
          memcpy(pvVar25,pMVar1->data,pMVar1->elemsize * lVar15);
          pvVar25 = (void *)((long)pvVar25 + (long)(int)lVar15 * (long)pMVar1->elempack * 4);
          iVar13 = local_44;
        }
      }
      if (iVar13 < local_48) {
        convert_packing(&local_90,local_40,local_48,opt);
      }
      if (local_90.refcount != (int *)0x0) {
        LOCK();
        *local_90.refcount = *local_90.refcount + -1;
        UNLOCK();
        if (*local_90.refcount == 0) {
          if (local_90.allocator == (Allocator *)0x0) {
            free(local_90.data);
          }
          else {
            (*(local_90.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_00182f9d;
    }
    if (local_90.refcount == (int *)0x0) {
      return -100;
    }
    LOCK();
    *local_90.refcount = *local_90.refcount + -1;
    UNLOCK();
    if (*local_90.refcount != 0) {
      return -100;
    }
    if (local_90.allocator != (Allocator *)0x0) {
      (*(local_90.allocator)->_vptr_Allocator[3])();
      return -100;
    }
LAB_0018340f:
    free(local_90.data);
  }
  else {
LAB_00182f9d:
    if ((uVar2 == 2) && (iVar6 == 1)) {
      pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar12 = pMVar27->h;
      sVar23 = pMVar27->elemsize;
      iVar19 = pMVar27->elempack;
      lVar5 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar27) / 0x48;
      piVar9 = &pMVar27->w;
      iVar13 = 0;
      while (bVar28 = lVar5 != 0, lVar5 = lVar5 + -1, bVar28) {
        iVar13 = iVar13 + *piVar9;
        piVar9 = piVar9 + 0x12;
      }
      pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar3,iVar13,uVar12,sVar23,iVar19,opt->blob_allocator);
      if (pMVar3->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar3->c * pMVar3->cstep == 0) {
        return -100;
      }
      uVar7 = 0;
      uVar22 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar22 = uVar7;
      }
      for (; uVar7 != uVar22; uVar7 = uVar7 + 1) {
        pvVar25 = (void *)((long)pMVar3->w * uVar7 * pMVar3->elemsize + (long)pMVar3->data);
        lVar5 = 0x2c;
        for (uVar16 = 0;
            pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar16 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar27) /
                            0x48); uVar16 = uVar16 + 1) {
          lVar15 = (long)*(int *)((long)&pMVar27->data + lVar5);
          memcpy(pvVar25,(void *)(uVar7 * lVar15 * *(long *)((long)pMVar27 + lVar5 + -0x1c) +
                                 *(long *)((long)pMVar27 + lVar5 + -0x2c)),lVar15 * sVar23);
          pvVar25 = (void *)((long)pvVar25 +
                            (long)*(int *)((long)&pMVar27->data + lVar5) * (long)iVar19 * 4);
          lVar5 = lVar5 + 0x48;
        }
      }
    }
    if ((uVar2 == 3) && (iVar6 == 0)) {
      pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar19 = pMVar27->w;
      iVar13 = pMVar27->h;
      psVar8 = &pMVar27->elemsize;
      sVar23 = pMVar27->elemsize;
      iVar11 = pMVar27->elempack;
      lVar5 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar27) / 0x48;
      uVar12 = 0;
      while (bVar28 = lVar5 != 0, lVar5 = lVar5 + -1, bVar28) {
        if (*psVar8 < sVar23) {
          sVar23 = *psVar8;
        }
        iVar17 = *(int *)(psVar8 + 1);
        if (iVar17 < iVar11) {
          iVar11 = iVar17;
        }
        uVar12 = uVar12 + iVar17 * *(int *)(psVar8 + 5);
        psVar8 = psVar8 + 9;
      }
      bVar4 = (uVar12 & 3) == 0 & opt->use_packing_layout;
      iVar17 = (uint)bVar4 + (uint)bVar4 * 2 + 1;
      pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar3,iVar19,iVar13,(int)uVar12 / iVar17,
                  sVar23 / (ulong)(long)iVar11 << bVar4 * '\x02',iVar17,opt->blob_allocator);
      local_90.data = pMVar3->data;
      if (local_90.data == (void *)0x0) {
        return -100;
      }
      local_90.cstep = pMVar3->cstep;
      local_90.c = pMVar3->c;
      if (local_90.cstep * (long)local_90.c == 0) {
        return -100;
      }
      local_90.refcount = pMVar3->refcount;
      local_90.elemsize = pMVar3->elemsize;
      local_90.elempack = pMVar3->elempack;
      local_90.allocator = pMVar3->allocator;
      local_90.dims = pMVar3->dims;
      local_90.w = pMVar3->w;
      local_90.h = pMVar3->h;
      local_90.d = pMVar3->d;
      if (local_90.refcount != (int *)0x0) {
        LOCK();
        *local_90.refcount = *local_90.refcount + 1;
        UNLOCK();
      }
      if ((iVar11 < iVar17) &&
         ((Mat::create(&local_90,iVar19,iVar13,(int)uVar12 / iVar11,sVar23,iVar11,
                       opt->workspace_allocator), local_90.data == (void *)0x0 ||
          ((long)local_90.c * local_90.cstep == 0)))) {
        if (local_90.refcount == (int *)0x0) {
          return -100;
        }
        LOCK();
        *local_90.refcount = *local_90.refcount + -1;
        UNLOCK();
        if (*local_90.refcount != 0) {
          return -100;
        }
        if (local_90.allocator != (Allocator *)0x0) {
          (*(local_90.allocator)->_vptr_Allocator[3])();
          return -100;
        }
        goto LAB_0018340f;
      }
      uVar7 = 0;
      for (uVar22 = 0;
          pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start,
          uVar22 < (ulong)(((long)(bottom_blobs->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_finish - (long)pMVar27) / 0x48);
          uVar22 = uVar22 + 1) {
        pMVar1 = pMVar27 + uVar22;
        iVar19 = pMVar27[uVar22].elempack;
        if ((iVar19 == 4) && (iVar11 == 1)) {
          iVar13 = pMVar1->h * pMVar1->w;
          lVar5 = local_90.cstep * local_90.elemsize;
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          uVar7 = (ulong)(int)uVar7;
          uVar12 = pMVar1->c;
          if (pMVar1->c < 1) {
            uVar12 = 0;
          }
          lVar15 = lVar5 * 4;
          pvVar21 = (void *)(lVar5 * uVar7 + (long)local_90.data);
          pvVar25 = (void *)((uVar7 + 1) * lVar5 + (long)local_90.data);
          pvVar10 = (void *)((uVar7 + 2) * lVar5 + (long)local_90.data);
          pvVar14 = (void *)((uVar7 + 3) * lVar5 + (long)local_90.data);
          for (uVar16 = 0; uVar16 != uVar12; uVar16 = uVar16 + 1) {
            puVar18 = (undefined4 *)(pMVar1->cstep * uVar16 * pMVar1->elemsize + (long)pMVar1->data)
            ;
            for (lVar5 = 0; iVar13 != (int)lVar5; lVar5 = lVar5 + 1) {
              *(undefined4 *)((long)pvVar21 + lVar5 * 4) = *puVar18;
              *(undefined4 *)((long)pvVar25 + lVar5 * 4) = puVar18[1];
              *(undefined4 *)((long)pvVar10 + lVar5 * 4) = puVar18[2];
              *(undefined4 *)((long)pvVar14 + lVar5 * 4) = puVar18[3];
              puVar18 = puVar18 + 4;
            }
            uVar7 = uVar7 + 4;
            pvVar21 = (void *)((long)pvVar21 + lVar15);
            pvVar25 = (void *)((long)pvVar25 + lVar15);
            pvVar10 = (void *)((long)pvVar10 + lVar15);
            pvVar14 = (void *)((long)pvVar14 + lVar15);
          }
        }
        if (iVar19 == iVar11) {
          memcpy((void *)(local_90.cstep * (long)(int)uVar7 * local_90.elemsize +
                         (long)local_90.data),pMVar1->data,
                 (long)((int)pMVar1->cstep * pMVar1->c) * pMVar1->elemsize);
          uVar7 = (ulong)(uint)((int)uVar7 + pMVar1->c);
        }
      }
      if (iVar11 < iVar17) {
        convert_packing(&local_90,pMVar3,iVar17,opt);
      }
      if (local_90.refcount != (int *)0x0) {
        LOCK();
        *local_90.refcount = *local_90.refcount + -1;
        UNLOCK();
        if (*local_90.refcount == 0) {
          if (local_90.allocator == (Allocator *)0x0) {
            free(local_90.data);
          }
          else {
            (*(local_90.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if ((uVar2 == 3) && (iVar6 == 1)) {
      pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar12 = pMVar27->c;
      sVar23 = pMVar27->elemsize;
      iVar19 = pMVar27->elempack;
      lVar5 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar27) / 0x48;
      piVar9 = &pMVar27->h;
      iVar13 = 0;
      while (bVar28 = lVar5 != 0, lVar5 = lVar5 + -1, bVar28) {
        iVar13 = iVar13 + *piVar9;
        piVar9 = piVar9 + 0x12;
      }
      pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar3,pMVar27->w,iVar13,uVar12,sVar23,iVar19,opt->blob_allocator);
      if (pMVar3->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar3->c * pMVar3->cstep == 0) {
        return -100;
      }
      uVar7 = 0;
      uVar22 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar22 = uVar7;
      }
      for (; uVar7 != uVar22; uVar7 = uVar7 + 1) {
        pvVar25 = (void *)(pMVar3->cstep * uVar7 * pMVar3->elemsize + (long)pMVar3->data);
        lVar5 = 0x40;
        for (uVar16 = 0;
            pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start,
            uVar16 < (ulong)(((long)(bottom_blobs->
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar27) /
                            0x48); uVar16 = uVar16 + 1) {
          lVar15 = (long)*(int *)((long)pMVar27 + lVar5 + -0x10) *
                   (long)*(int *)((long)pMVar27 + lVar5 + -0x14);
          memcpy(pvVar25,(void *)(*(long *)((long)&pMVar27->data + lVar5) * uVar7 *
                                  *(long *)((long)pMVar27 + lVar5 + -0x30) +
                                 *(long *)((long)pMVar27 + lVar5 + -0x40)),lVar15 * sVar23);
          pvVar25 = (void *)((long)pvVar25 + (long)((int)lVar15 * iVar19) * 4);
          lVar5 = lVar5 + 0x48;
        }
      }
    }
    if (uVar2 != 3) {
      return 0;
    }
    if (iVar6 != 2) {
      return 0;
    }
    pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar2 = pMVar27->h;
    uVar12 = pMVar27->c;
    sVar23 = pMVar27->elemsize;
    iVar6 = pMVar27->elempack;
    lVar5 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar27) / 0x48;
    piVar9 = &pMVar27->w;
    iVar19 = 0;
    while (bVar28 = lVar5 != 0, lVar5 = lVar5 + -1, bVar28) {
      iVar19 = iVar19 + *piVar9;
      piVar9 = piVar9 + 0x12;
    }
    pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar3,iVar19,uVar2,uVar12,sVar23,iVar6,opt->blob_allocator);
    if (pMVar3->data != (void *)0x0) {
      if ((long)pMVar3->c * pMVar3->cstep != 0) {
        uVar22 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar22 = 0;
        }
        uVar7 = (ulong)uVar12;
        if ((int)uVar12 < 1) {
          uVar7 = 0;
        }
        for (uVar16 = 0; uVar16 != uVar7; uVar16 = uVar16 + 1) {
          pvVar25 = (void *)(pMVar3->cstep * uVar16 * pMVar3->elemsize + (long)pMVar3->data);
          for (uVar26 = 0; uVar26 != uVar22; uVar26 = uVar26 + 1) {
            lVar5 = 0x40;
            for (uVar24 = 0;
                pMVar27 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start,
                uVar24 < (ulong)(((long)(bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar27) /
                                0x48); uVar24 = uVar24 + 1) {
              lVar20 = (long)*(int *)((long)pMVar27 + lVar5 + -0x14);
              lVar15 = *(long *)((long)pMVar27 + lVar5 + -0x30);
              memcpy(pvVar25,(void *)(uVar26 * lVar20 * lVar15 +
                                     *(long *)((long)&pMVar27->data + lVar5) * uVar16 * lVar15 +
                                     *(long *)((long)pMVar27 + lVar5 + -0x40)),lVar20 * sVar23);
              pvVar25 = (void *)((long)pvVar25 +
                                (long)*(int *)((long)pMVar27 + lVar5 + -0x14) * (long)iVar6 * 4);
              lVar5 = lVar5 + 0x48;
            }
          }
        }
        return 0;
      }
      return -100;
    }
  }
  return -100;
}

Assistant:

int Concat_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // concat vector
        // total length
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_w % 16 == 0 ? 16 : top_w % 8 == 0 ? 8 : top_w % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_w % 8 == 0 ? 8 : top_w % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_w % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, bottom_blob.w * bottom_blob.elemsize);

            outptr += bottom_blob.w * bottom_blob.elempack;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_h += bottom_blob.h * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_h % 16 == 0 ? 16 : top_h % 8 == 0 ? 8 : top_h % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_h % 8 == 0 ? 8 : top_h % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_h % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, top_h / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;
        }

        float* outptr = top_blob_unpacked;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
#if __AVX512F__
            if (bottom_blob.elempack == 16 && elempack == 8)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 8;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr1[0] = r0[8];
                        outptr1[1] = r0[9];
                        outptr1[2] = r0[10];
                        outptr1[3] = r0[11];
                        outptr1[4] = r0[12];
                        outptr1[5] = r0[13];
                        outptr1[6] = r0[14];
                        outptr1[7] = r0[15];

                        outptr0 += 8;
                        outptr1 += 8;
                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 4)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 4;
                    float* outptr2 = outptr + w * 8;
                    float* outptr3 = outptr + w * 12;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];
                        outptr2[0] = r0[8];
                        outptr2[1] = r0[9];
                        outptr2[2] = r0[10];
                        outptr2[3] = r0[11];
                        outptr3[0] = r0[12];
                        outptr3[1] = r0[13];
                        outptr3[2] = r0[14];
                        outptr3[3] = r0[15];

                        outptr0 += 4;
                        outptr1 += 4;
                        outptr2 += 4;
                        outptr3 += 4;
                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;
                    float* outptr4 = outptr + w * 4;
                    float* outptr5 = outptr + w * 5;
                    float* outptr6 = outptr + w * 6;
                    float* outptr7 = outptr + w * 7;
                    float* outptr8 = outptr + w * 8;
                    float* outptr9 = outptr + w * 9;
                    float* outptra = outptr + w * 10;
                    float* outptrb = outptr + w * 11;
                    float* outptrc = outptr + w * 12;
                    float* outptrd = outptr + w * 13;
                    float* outptre = outptr + w * 14;
                    float* outptrf = outptr + w * 15;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];
                        *outptr8++ = r0[8];
                        *outptr9++ = r0[9];
                        *outptra++ = r0[10];
                        *outptrb++ = r0[11];
                        *outptrc++ = r0[12];
                        *outptrd++ = r0[13];
                        *outptre++ = r0[14];
                        *outptrf++ = r0[15];

                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
#endif // __AVX512F__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 4;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;
                    float* outptr4 = outptr + w * 4;
                    float* outptr5 = outptr + w * 5;
                    float* outptr6 = outptr + w * 6;
                    float* outptr7 = outptr + w * 7;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    outptr += w * 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8 16-16
            {
                int size = w * bottom_blob.h;

                const float* ptr = bottom_blob;
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                outptr += size * bottom_blob.elempack;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* outptr = top_blob.row(i);
            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const float* ptr = bottom_blob.row(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_channels = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_channels += bottom_blob.c * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_channels % 16 == 0 ? 16 : top_channels % 8 == 0 ? 8 : top_channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_channels % 8 == 0 ? 8 : top_channels % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, h, top_channels / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;
        }

        int p = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
#if __AVX512F__
            if (bottom_blob.elempack == 16 && elempack == 8)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr1[0] = r0[8];
                        outptr1[1] = r0[9];
                        outptr1[2] = r0[10];
                        outptr1[3] = r0[11];
                        outptr1[4] = r0[12];
                        outptr1[5] = r0[13];
                        outptr1[6] = r0[14];
                        outptr1[7] = r0[15];

                        outptr0 += 8;
                        outptr1 += 8;
                        r0 += 16;
                    }

                    p += 2;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 4)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];
                        outptr2[0] = r0[8];
                        outptr2[1] = r0[9];
                        outptr2[2] = r0[10];
                        outptr2[3] = r0[11];
                        outptr3[0] = r0[12];
                        outptr3[1] = r0[13];
                        outptr3[2] = r0[14];
                        outptr3[3] = r0[15];

                        outptr0 += 4;
                        outptr1 += 4;
                        outptr2 += 4;
                        outptr3 += 4;
                        r0 += 16;
                    }

                    p += 4;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);
                    float* outptr4 = top_blob_unpacked.channel(p + 4);
                    float* outptr5 = top_blob_unpacked.channel(p + 5);
                    float* outptr6 = top_blob_unpacked.channel(p + 6);
                    float* outptr7 = top_blob_unpacked.channel(p + 7);
                    float* outptr8 = top_blob_unpacked.channel(p + 8);
                    float* outptr9 = top_blob_unpacked.channel(p + 9);
                    float* outptra = top_blob_unpacked.channel(p + 10);
                    float* outptrb = top_blob_unpacked.channel(p + 11);
                    float* outptrc = top_blob_unpacked.channel(p + 12);
                    float* outptrd = top_blob_unpacked.channel(p + 13);
                    float* outptre = top_blob_unpacked.channel(p + 14);
                    float* outptrf = top_blob_unpacked.channel(p + 15);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];
                        *outptr8++ = r0[8];
                        *outptr9++ = r0[9];
                        *outptra++ = r0[10];
                        *outptrb++ = r0[11];
                        *outptrc++ = r0[12];
                        *outptrd++ = r0[13];
                        *outptre++ = r0[14];
                        *outptrf++ = r0[15];

                        r0 += 16;
                    }

                    p += 16;
                }
            }
#endif // __AVX512F__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    p += 2;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);
                    float* outptr4 = top_blob_unpacked.channel(p + 4);
                    float* outptr5 = top_blob_unpacked.channel(p + 5);
                    float* outptr6 = top_blob_unpacked.channel(p + 6);
                    float* outptr7 = top_blob_unpacked.channel(p + 7);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    p += 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8
            {
                int size = bottom_blob.total();

                const float* ptr = bottom_blob;
                float* outptr = top_blob_unpacked.channel(p);
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                p += bottom_blob.c;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const float* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                for (size_t b = 0; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const float* ptr = bottom_blob.channel(q).row(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w * elempack;
                }
            }
        }
    }

    return 0;
}